

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O0

Status __thiscall spvtools::opt::IfConversion::Process(IfConversion *this)

{
  bool bVar1;
  bool bVar2;
  Op OVar3;
  Analysis preserved_analyses;
  IRContext *pIVar4;
  FeatureManager *this_00;
  ValueNumberTable *pVVar5;
  Module *this_01;
  reference f;
  DominatorAnalysis *dominators_00;
  reference block_00;
  Instruction *pIVar6;
  reference ppIVar7;
  Instruction *inst;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_1;
  InstructionBuilder *local_138;
  bool *local_130;
  iterator *local_128;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_120;
  DominatorAnalysis *local_118;
  reference local_110;
  ValueNumberTable *local_108;
  function<void_(spvtools::opt::Instruction_*)> local_100;
  undefined1 local_e0 [8];
  InstructionBuilder builder;
  undefined1 local_b8 [8];
  iterator iter;
  BasicBlock *common;
  value_type *block;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  DominatorAnalysis *dominators;
  value_type *func;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> to_kill;
  bool modified;
  ValueNumberTable *vn_table;
  IfConversion *this_local;
  
  pIVar4 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_feature_mgr(pIVar4);
  bVar1 = FeatureManager::HasCapability(this_00,Shader);
  if (bVar1) {
    pIVar4 = Pass::context(&this->super_Pass);
    pVVar5 = IRContext::GetValueNumberTable(pIVar4);
    to_kill.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&__range2);
    this_01 = Pass::get_module(&this->super_Pass);
    join_0x00000010_0x00000000_ = Module::begin(this_01);
    _func = Module::end(this_01);
    while (bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                             ((UptrVectorIterator<spvtools::opt::Function,_false> *)
                              &__end2.iterator_,
                              (UptrVectorIterator<spvtools::opt::Function,_false> *)&func), bVar1) {
      f = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                    ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
      pIVar4 = Pass::context(&this->super_Pass);
      dominators_00 = IRContext::GetDominatorAnalysis(pIVar4,f);
      join_0x00000010_0x00000000_ = Function::begin(f);
      _block = Function::end(f);
      while (bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                               ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                                &__end3.iterator_,
                                (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&block),
            bVar1) {
        block_00 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                              &__end3.iterator_);
        iter.super_iterator.node_ = (iterator)(Instruction *)0x0;
        bVar1 = CheckBlock(this,block_00,dominators_00,(BasicBlock **)&iter);
        if (bVar1) {
          BasicBlock::begin((BasicBlock *)local_b8);
          while( true ) {
            BasicBlock::end((BasicBlock *)&builder.preserved_analyses_);
            bVar2 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_b8,
                                      (iterator_template<spvtools::opt::Instruction> *)
                                      &builder.preserved_analyses_);
            bVar1 = false;
            if (bVar2) {
              pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
                       iterator_template<spvtools::opt::Instruction>::operator->
                                 ((iterator_template<spvtools::opt::Instruction> *)local_b8);
              OVar3 = Instruction::opcode(pIVar6);
              bVar1 = OVar3 == OpPhi;
            }
            if (!bVar1) break;
            InstructionList::iterator::operator++((iterator *)local_b8);
          }
          pIVar4 = Pass::context(&this->super_Pass);
          pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator*
                             ((iterator_template<spvtools::opt::Instruction> *)local_b8);
          preserved_analyses = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
          InstructionBuilder::InstructionBuilder
                    ((InstructionBuilder *)local_e0,pIVar4,pIVar6,preserved_analyses);
          local_138 = (InstructionBuilder *)local_e0;
          local_130 = (bool *)((long)&to_kill.
                                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
          local_128 = &iter;
          local_120 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       *)&__range2;
          __range2_1 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        *)this;
          local_118 = dominators_00;
          local_110 = block_00;
          local_108 = pVVar5;
          std::function<void(spvtools::opt::Instruction*)>::
          function<spvtools::opt::IfConversion::Process()::__0,void>
                    ((function<void(spvtools::opt::Instruction*)> *)&local_100,
                     (anon_class_64_8_8a05fac6 *)&__range2_1);
          BasicBlock::ForEachPhiInst(block_00,&local_100,false);
          std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_100);
        }
        UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                  ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_);
      }
      UptrVectorIterator<spvtools::opt::Function,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    }
    __end2_1 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&__range2);
    inst = (Instruction *)
           std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                               *)&inst), bVar1) {
      ppIVar7 = __gnu_cxx::
                __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                ::operator*(&__end2_1);
      pIVar6 = *ppIVar7;
      pIVar4 = Pass::context(&this->super_Pass);
      IRContext::KillInst(pIVar4,pIVar6);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2_1);
    }
    this_local._4_4_ = SuccessWithoutChange;
    if ((to_kill.
         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      this_local._4_4_ = SuccessWithChange;
    }
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            &__range2);
  }
  else {
    this_local._4_4_ = SuccessWithoutChange;
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status IfConversion::Process() {
  if (!context()->get_feature_mgr()->HasCapability(spv::Capability::Shader)) {
    return Status::SuccessWithoutChange;
  }

  const ValueNumberTable& vn_table = *context()->GetValueNumberTable();
  bool modified = false;
  std::vector<Instruction*> to_kill;
  for (auto& func : *get_module()) {
    DominatorAnalysis* dominators = context()->GetDominatorAnalysis(&func);
    for (auto& block : func) {
      // Check if it is possible for |block| to have phis that can be
      // transformed.
      BasicBlock* common = nullptr;
      if (!CheckBlock(&block, dominators, &common)) continue;

      // Get an insertion point.
      auto iter = block.begin();
      while (iter != block.end() && iter->opcode() == spv::Op::OpPhi) {
        ++iter;
      }

      InstructionBuilder builder(
          context(), &*iter,
          IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
      block.ForEachPhiInst([this, &builder, &modified, &common, &to_kill,
                            dominators, &block, &vn_table](Instruction* phi) {
        // This phi is not compatible, but subsequent phis might be.
        if (!CheckType(phi->type_id())) return;

        // We cannot transform cases where the phi is used by another phi in the
        // same block due to instruction ordering restrictions.
        // TODO(alan-baker): If all inappropriate uses could also be
        // transformed, we could still remove this phi.
        if (!CheckPhiUsers(phi, &block)) return;

        // Identify the incoming values associated with the true and false
        // branches. If |then_block| dominates |inc0| or if the true edge
        // branches straight to this block and |common| is |inc0|, then |inc0|
        // is on the true branch. Otherwise the |inc1| is on the true branch.
        BasicBlock* inc0 = GetIncomingBlock(phi, 0u);
        Instruction* branch = common->terminator();
        uint32_t condition = branch->GetSingleWordInOperand(0u);
        BasicBlock* then_block = GetBlock(branch->GetSingleWordInOperand(1u));
        Instruction* true_value = nullptr;
        Instruction* false_value = nullptr;
        if ((then_block == &block && inc0 == common) ||
            dominators->Dominates(then_block, inc0)) {
          true_value = GetIncomingValue(phi, 0u);
          false_value = GetIncomingValue(phi, 1u);
        } else {
          true_value = GetIncomingValue(phi, 1u);
          false_value = GetIncomingValue(phi, 0u);
        }

        BasicBlock* true_def_block = context()->get_instr_block(true_value);
        BasicBlock* false_def_block = context()->get_instr_block(false_value);

        uint32_t true_vn = vn_table.GetValueNumber(true_value);
        uint32_t false_vn = vn_table.GetValueNumber(false_value);
        if (true_vn != 0 && true_vn == false_vn) {
          Instruction* inst_to_use = nullptr;

          // Try to pick an instruction that is not in a side node.  If we can't
          // pick either the true for false branch as long as they can be
          // legally moved.
          if (!true_def_block ||
              dominators->Dominates(true_def_block, &block)) {
            inst_to_use = true_value;
          } else if (!false_def_block ||
                     dominators->Dominates(false_def_block, &block)) {
            inst_to_use = false_value;
          } else if (CanHoistInstruction(true_value, common, dominators)) {
            inst_to_use = true_value;
          } else if (CanHoistInstruction(false_value, common, dominators)) {
            inst_to_use = false_value;
          }

          if (inst_to_use != nullptr) {
            modified = true;
            HoistInstruction(inst_to_use, common, dominators);
            context()->KillNamesAndDecorates(phi);
            context()->ReplaceAllUsesWith(phi->result_id(),
                                          inst_to_use->result_id());
          }
          return;
        }

        // If either incoming value is defined in a block that does not dominate
        // this phi, then we cannot eliminate the phi with a select.
        // TODO(alan-baker): Perform code motion where it makes sense to enable
        // the transform in this case.
        if (true_def_block && !dominators->Dominates(true_def_block, &block))
          return;

        if (false_def_block && !dominators->Dominates(false_def_block, &block))
          return;

        analysis::Type* data_ty =
            context()->get_type_mgr()->GetType(true_value->type_id());
        if (analysis::Vector* vec_data_ty = data_ty->AsVector()) {
          condition = SplatCondition(vec_data_ty, condition, &builder);
        }

        Instruction* select = builder.AddSelect(phi->type_id(), condition,
                                                true_value->result_id(),
                                                false_value->result_id());
        context()->get_def_use_mgr()->AnalyzeInstDefUse(select);
        select->UpdateDebugInfoFrom(phi);
        context()->ReplaceAllUsesWith(phi->result_id(), select->result_id());
        to_kill.push_back(phi);
        modified = true;

        return;
      });
    }
  }

  for (auto inst : to_kill) {
    context()->KillInst(inst);
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}